

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

ssize_t __thiscall r_code::SysView::write(SysView *this,int __fd,void *__buf,size_t __n)

{
  pointer pAVar1;
  Atom *pAVar2;
  ulong uVar3;
  uint *puVar4;
  pointer pAVar5;
  uint32_t *puVar6;
  undefined4 in_register_00000034;
  undefined4 *puVar7;
  size_t j;
  ulong uVar8;
  
  puVar7 = (undefined4 *)CONCAT44(in_register_00000034,__fd);
  pAVar5 = (this->super_ImageObject).code.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar1 = (this->super_ImageObject).code.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *puVar7 = (int)((ulong)((long)pAVar1 - (long)pAVar5) >> 2);
  puVar7[1] = (int)((ulong)((long)(this->super_ImageObject).references.m_vector.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->super_ImageObject).references.m_vector.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
  puVar6 = puVar7 + 2;
  for (uVar8 = 0; uVar8 < (ulong)((long)pAVar1 - (long)pAVar5 >> 2); uVar8 = uVar8 + 1) {
    pAVar2 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,uVar8);
    *puVar6 = pAVar2->atom;
    pAVar5 = (this->super_ImageObject).code.m_vector.
             super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
             super__Vector_impl_data._M_start;
    pAVar1 = (this->super_ImageObject).code.m_vector.
             super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar6 = puVar6 + 1;
  }
  for (uVar8 = 0;
      uVar3 = (long)(this->super_ImageObject).references.m_vector.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->super_ImageObject).references.m_vector.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2, uVar8 < uVar3; uVar8 = uVar8 + 1) {
    puVar4 = vector<unsigned_int>::operator[](&(this->super_ImageObject).references,uVar8);
    *puVar6 = *puVar4;
    puVar6 = puVar6 + 1;
  }
  return uVar3;
}

Assistant:

void SysView::write(uint32_t *data)
{
    data[0] = code.size();
    data[1] = references.size();
    size_t i = 0;

    for (; i < code.size(); ++i) {
        data[2 + i] = code[i].atom;
    }

    for (size_t j = 0; j < references.size(); ++j) {
        data[2 + i + j] = references[j];
    }
}